

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O1

void __thiscall tcmalloc::ThreadCache::IncreaseCacheLimitLocked(ThreadCache *this)

{
  uint uVar1;
  
  if (unclaimed_cache_space < 1) {
    if (next_cache_steal != (ThreadCache *)0x0) {
      uVar1 = 10;
      do {
        if ((next_cache_steal != this && next_cache_steal != (ThreadCache *)cache_list) &&
           (0x80000 < next_cache_steal->max_size_)) {
          this->max_size_ = this->max_size_ + 0x10000;
          next_cache_steal->max_size_ = next_cache_steal->max_size_ - 0x10000;
          next_cache_steal = next_cache_steal->next;
          return;
        }
        next_cache_steal = next_cache_steal->next;
      } while ((1 < uVar1) && (uVar1 = uVar1 - 1, next_cache_steal != (ThreadCache *)0x0));
    }
  }
  else {
    unclaimed_cache_space = unclaimed_cache_space + -0x10000;
    this->max_size_ = this->max_size_ + 0x10000;
  }
  return;
}

Assistant:

void IncreaseCacheLimitLocked() {
        if (unclaimed_cache_space > 0) {
            unclaimed_cache_space -= kStealAmount;
            max_size_ += kStealAmount;
            return;
        }
        // 从其他线程偷，只检查10个，防止加锁太久和无限循环
        int check = 10;
        while (check > 0 && next_cache_steal != nullptr) {
            if (next_cache_steal != &cache_list &&
                next_cache_steal != this && next_cache_steal->max_size_ > kMinThreadCacheSize) {
                max_size_ += kStealAmount;
                next_cache_steal->max_size_ -= kStealAmount;
                next_cache_steal = next_cache_steal->next;
                return;
            }
            check--;
            next_cache_steal = next_cache_steal->next;
        }
    }